

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetDeviceOutputSubsamples
          (VClient *this,string *i_rDeviceName,string *i_rDeviceOutputName,string *i_rComponentName,
          uint *o_rDeviceOutputSubsamples,bool *o_rbOccluded)

{
  uint i_DeviceID;
  UInt64 i_DevicePeriod;
  bool bVar1;
  __type _Var2;
  VDeviceInfo *pVVar3;
  reference rChannel_00;
  ulong uVar4;
  reference i_rDeviceOutputName_00;
  TPeriod TVar5;
  string local_f0;
  int local_cc;
  const_iterator cStack_c8;
  uint ComponentIndex;
  const_iterator ComponentEnd;
  const_iterator ComponentIt;
  VChannelInfo *rChannel;
  const_iterator ChannelEnd;
  const_iterator ChannelIt;
  undefined1 auStack_98 [4];
  uint CurrentDeviceOutputIndex;
  TPeriod FramePeriod;
  Int64 DeviceStartTick;
  UInt64 DevicePeriod;
  uint DeviceID;
  VDeviceInfo *pDevice;
  Enum local_54;
  undefined1 local_50 [4];
  Enum GetResult;
  scoped_lock Lock;
  bool *o_rbOccluded_local;
  uint *o_rDeviceOutputSubsamples_local;
  string *i_rComponentName_local;
  string *i_rDeviceOutputName_local;
  string *i_rDeviceName_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rbOccluded;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_50,&this->m_FrameMutex);
  local_54 = Success;
  bVar1 = InitGet<unsigned_int>(this,&local_54,o_rDeviceOutputSubsamples);
  if (bVar1) {
    pVVar3 = GetDevice(this,i_rDeviceName,&local_54);
    if (pVVar3 == (VDeviceInfo *)0x0) {
      this_local._4_4_ = local_54;
    }
    else {
      i_DeviceID = pVVar3->m_DeviceID;
      i_DevicePeriod = pVVar3->m_FramePeriod;
      FramePeriod.second = GetDeviceStartTick(this,i_DeviceID);
      TVar5 = anon_unknown.dwarf_9508b::GetFramePeriod(&this->m_LatestFrame);
      FramePeriod.first = TVar5.second;
      _auStack_98 = TVar5.first;
      ChannelIt._M_current._4_4_ = 0;
      ChannelEnd = std::
                   vector<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
                   ::begin(&(this->m_LatestFrame).m_Channels);
      rChannel = (VChannelInfo *)
                 std::
                 vector<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>::
                 end(&(this->m_LatestFrame).m_Channels);
      while (bVar1 = __gnu_cxx::operator!=
                               (&ChannelEnd,
                                (__normal_iterator<const_ViconCGStream::VChannelInfo_*,_std::vector<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>_>
                                 *)&rChannel), bVar1) {
        rChannel_00 = __gnu_cxx::
                      __normal_iterator<const_ViconCGStream::VChannelInfo_*,_std::vector<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>_>
                      ::operator*(&ChannelEnd);
        if ((rChannel_00->m_DeviceID == i_DeviceID) &&
           ((uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0 ||
            (bVar1 = std::operator!=(&rChannel_00->m_Name,i_rDeviceOutputName), !bVar1)))) {
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&rChannel_00->m_ComponentNames);
          if (bVar1) {
            this_local._4_4_ = NoFrame;
            goto LAB_0013d0e8;
          }
          ComponentEnd = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin(&rChannel_00->m_ComponentNames);
          cStack_c8 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(&rChannel_00->m_ComponentNames);
          local_cc = 0;
          while (bVar1 = __gnu_cxx::operator!=(&ComponentEnd,&stack0xffffffffffffff38), bVar1) {
            i_rDeviceOutputName_00 =
                 __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&ComponentEnd);
            ClientUtils::AdaptDeviceOutputName
                      (&local_f0,i_rDeviceOutputName_00,ChannelIt._M_current._4_4_);
            _Var2 = std::operator==(i_rComponentName,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            if (_Var2) {
              bVar1 = IsForcePlateForceChannel(this,rChannel_00);
              if (bVar1) {
                bVar1 = anon_unknown_11::GetSampleCount<ViconCGStream::VForceFrame>
                                  (&(this->m_LatestFrame).m_Forces,rChannel_00,i_DevicePeriod,
                                   FramePeriod.second,(TPeriod *)auStack_98,
                                   o_rDeviceOutputSubsamples);
                *(byte *)Lock._8_8_ = (bVar1 ^ 0xffU) & 1;
              }
              else {
                bVar1 = IsForcePlateMomentChannel(this,rChannel_00);
                if (bVar1) {
                  bVar1 = anon_unknown_11::GetSampleCount<ViconCGStream::VMomentFrame>
                                    (&(this->m_LatestFrame).m_Moments,rChannel_00,i_DevicePeriod,
                                     FramePeriod.second,(TPeriod *)auStack_98,
                                     o_rDeviceOutputSubsamples);
                  *(byte *)Lock._8_8_ = (bVar1 ^ 0xffU) & 1;
                }
                else {
                  bVar1 = IsForcePlateCoPChannel(this,rChannel_00);
                  if (bVar1) {
                    bVar1 = anon_unknown_11::GetSampleCount<ViconCGStream::VCentreOfPressureFrame>
                                      (&(this->m_LatestFrame).m_CentresOfPressure,rChannel_00,
                                       i_DevicePeriod,FramePeriod.second,(TPeriod *)auStack_98,
                                       o_rDeviceOutputSubsamples);
                    *(byte *)Lock._8_8_ = (bVar1 ^ 0xffU) & 1;
                  }
                  else {
                    bVar1 = anon_unknown_11::GetSampleCount<ViconCGStream::VVoltageFrame>
                                      (&(this->m_LatestFrame).m_Voltages,rChannel_00,i_DevicePeriod,
                                       FramePeriod.second,(TPeriod *)auStack_98,
                                       o_rDeviceOutputSubsamples);
                    *(byte *)Lock._8_8_ = (bVar1 ^ 0xffU) & 1;
                  }
                }
              }
              this_local._4_4_ = Success;
              goto LAB_0013d0e8;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&ComponentEnd);
            local_cc = local_cc + 1;
            ChannelIt._M_current._4_4_ = ChannelIt._M_current._4_4_ + 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_ViconCGStream::VChannelInfo_*,_std::vector<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>_>
        ::operator++(&ChannelEnd);
      }
      this_local._4_4_ = InvalidDeviceOutputName;
    }
  }
  else {
    this_local._4_4_ = local_54;
  }
LAB_0013d0e8:
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_50);
  return this_local._4_4_;
}

Assistant:

Result::Enum VClient::GetDeviceOutputSubsamples( const std::string  & i_rDeviceName,
                                                 const std::string  & i_rDeviceOutputName, 
                                                 const std::string  & i_rComponentName,
                                                       unsigned int & o_rDeviceOutputSubsamples,
                                                       bool         & o_rbOccluded ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rDeviceOutputSubsamples ) )
  {
    return GetResult; 
  }

  const ViconCGStream::VDeviceInfo * pDevice = GetDevice( i_rDeviceName, GetResult );
  if ( !pDevice )
  {
    return GetResult; 
  }
  const unsigned int DeviceID = pDevice->m_DeviceID;
  const ViconCGStreamType::UInt64 DevicePeriod = pDevice->m_FramePeriod;

  ViconCGStreamType::Int64 DeviceStartTick = GetDeviceStartTick( DeviceID );

  const TPeriod FramePeriod = GetFramePeriod( m_LatestFrame );

  // Iterate over the channels for this device
  unsigned int CurrentDeviceOutputIndex = 0;
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelIt  = m_LatestFrame.m_Channels.begin();
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelEnd = m_LatestFrame.m_Channels.end();
  for ( ; ChannelIt != ChannelEnd; ++ChannelIt )
  {
    const ViconCGStream::VChannelInfo & rChannel( *ChannelIt );

    // Wrong device
    if ( rChannel.m_DeviceID != DeviceID )
    {
      continue;
    }

    if ( !i_rDeviceOutputName.empty() )
    {
      if ( rChannel.m_Name != i_rDeviceOutputName )
      {
        continue;
      }
    }

    if( rChannel.m_ComponentNames.empty() )
    {
      return Result::NoFrame;
    }

    std::vector< std::string >::const_iterator ComponentIt  = rChannel.m_ComponentNames.begin();
    std::vector< std::string >::const_iterator ComponentEnd = rChannel.m_ComponentNames.end();
    for( unsigned int ComponentIndex = 0 ; ComponentIt != ComponentEnd ; ++ComponentIt, ++ComponentIndex, ++CurrentDeviceOutputIndex )
    {
      if( i_rComponentName == AdaptDeviceOutputName( *ComponentIt, CurrentDeviceOutputIndex ) )
      {
        // This is the correct component.
        // Find the correct data array.

        if( IsForcePlateForceChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Forces, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else if( IsForcePlateMomentChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Moments, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else if( IsForcePlateCoPChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_CentresOfPressure, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Voltages, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }

        return Result::Success;
      }
    }
  }

  return Result::InvalidDeviceOutputName;
}